

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

int __thiscall
CTPNStmEnclosing::gen_code_continue_loop
          (CTPNStmEnclosing *this,CTcCodeLabel *code_label,textchar_t *lbl,size_t lbl_len)

{
  long *plVar1;
  undefined8 in_RCX;
  long in_RDX;
  CTcCodeStream *in_RDI;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  CTcCodeLabel *in_stack_ffffffffffffffc8;
  int local_4;
  
  if (in_RDX == 0) {
    CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    CTcCodeStream::write_ofs2(in_RDI,in_stack_ffffffffffffffc8,0);
    local_4 = 1;
  }
  else if ((in_RDI->super_CTcDataStream).rem_ == 0) {
    local_4 = 0;
  }
  else {
    plVar1 = (long *)(in_RDI->super_CTcDataStream).rem_;
    local_4 = (**(code **)(*plVar1 + 0x100))(plVar1,in_RDX,in_RCX);
  }
  return local_4;
}

Assistant:

int CTPNStmEnclosing::gen_code_continue_loop(CTcCodeLabel *code_label,
                                             const textchar_t *lbl,
                                             size_t lbl_len)
{
    /* 
     *   If the statement is labeled, let the enclosing statement handle
     *   it -- since it's labeled, we can't assume the statement refers to
     *   us without searching for the enclosing label.  
     */
    if (lbl != 0)
    {
        /* if there's an enclosing statement, let it handle it */
        if (enclosing_ != 0)
            return enclosing_->gen_code_continue(lbl, lbl_len);

        /* 
         *   there's no enclosing statement, and we can't handle this
         *   because it has an explicit label attached - indicate that no
         *   continue has been generated and give up 
         */
        return FALSE;
    }

    /* 
     *   it's unlabeled, so we can take it by default as the nearest
     *   enclosing statement for which 'continue' makes sense -- generate
     *   the jump to the given code label 
     */
    G_cg->write_op(OPC_JMP);
    G_cs->write_ofs2(code_label, 0);

    /* we have generated the continue */
    return TRUE;
}